

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallGenerator::cmInstallGenerator
          (cmInstallGenerator *this,char *destination,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,bool exclude_from_all)

{
  char *pcVar1;
  allocator local_55;
  MessageLevel local_54;
  string local_50;
  
  local_54 = message;
  std::__cxx11::string::string((string *)&local_50,"CMAKE_INSTALL_CONFIG_NAME",&local_55);
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_50,configurations);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallGenerator_00731850;
  if (destination == (char *)0x0) {
    destination = "";
  }
  std::__cxx11::string::string((string *)&this->Destination,destination,(allocator *)&local_50);
  pcVar1 = "";
  if (component != (char *)0x0) {
    pcVar1 = component;
  }
  std::__cxx11::string::string((string *)&this->Component,pcVar1,(allocator *)&local_50);
  this->Message = local_54;
  this->ExcludeFromAll = exclude_from_all;
  return;
}

Assistant:

cmInstallGenerator::cmInstallGenerator(
  const char* destination, std::vector<std::string> const& configurations,
  const char* component, MessageLevel message, bool exclude_from_all)
  : cmScriptGenerator("CMAKE_INSTALL_CONFIG_NAME", configurations)
  , Destination(destination ? destination : "")
  , Component(component ? component : "")
  , Message(message)
  , ExcludeFromAll(exclude_from_all)
{
}